

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::RenderText(ImVec2 pos,char *text,char *text_end,bool hide_text_after_hash)

{
  size_t sVar1;
  undefined1 in_DL;
  ImVec2 *in_RSI;
  ImVec2 *in_RDI;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  ImDrawList *unaff_retaddr;
  ImVec4 *in_stack_00000010;
  char *text_display_end;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImGuiWindow *text_end_00;
  ImGuiContext *pIVar2;
  undefined4 in_stack_ffffffffffffffe0;
  undefined3 in_stack_ffffffffffffffe4;
  ImU32 col;
  ImVec2 *pIVar3;
  ImVec2 *ref_pos;
  ImFont *font;
  
  font = (ImFont *)CONCAT44(in_XMM0_Db,in_XMM0_Da);
  col = CONCAT13(in_DL,in_stack_ffffffffffffffe4) & 0x1ffffff;
  text_end_00 = GImGui->CurrentWindow;
  pIVar2 = GImGui;
  pIVar3 = in_RSI;
  if ((char)(col >> 0x18) == '\0') {
    ref_pos = in_RDI;
    if (in_RSI == (ImVec2 *)0x0) {
      sVar1 = strlen((char *)in_RDI);
      in_RSI = (ImVec2 *)((long)&in_RDI->x + sVar1);
      pIVar3 = in_RSI;
    }
  }
  else {
    in_RSI = (ImVec2 *)FindRenderedTextEnd((char *)in_RDI,(char *)in_RSI);
    ref_pos = in_RDI;
  }
  if (ref_pos != in_RSI) {
    GetColorU32((ImGuiCol)((ulong)pIVar2->Font >> 0x20),SUB84(pIVar2->Font,0));
    ImDrawList::AddText(unaff_retaddr,font,(float)((ulong)ref_pos >> 0x20),pIVar3,col,
                        &pIVar2->Initialized,(char *)text_end_00,(float)((ulong)in_RSI >> 0x20),
                        in_stack_00000010);
    if ((pIVar2->LogEnabled & 1U) != 0) {
      LogRenderedText(ref_pos,(char *)pIVar3,(char *)CONCAT44(col,in_stack_ffffffffffffffe0));
    }
  }
  return;
}

Assistant:

void ImGui::RenderText(ImVec2 pos, const char* text, const char* text_end, bool hide_text_after_hash)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    // Hide anything after a '##' string
    const char* text_display_end;
    if (hide_text_after_hash)
    {
        text_display_end = FindRenderedTextEnd(text, text_end);
    }
    else
    {
        if (!text_end)
            text_end = text + strlen(text); // FIXME-OPT
        text_display_end = text_end;
    }

    if (text != text_display_end)
    {
        window->DrawList->AddText(g.Font, g.FontSize, pos, GetColorU32(ImGuiCol_Text), text, text_display_end);
        if (g.LogEnabled)
            LogRenderedText(&pos, text, text_display_end);
    }
}